

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::objectivec::ObjectiveCGenerator::GenerateAll
          (ObjectiveCGenerator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *context,string *error)

{
  protobuf *this_00;
  size_t size;
  pointer pcVar1;
  FileDescriptor *file;
  pointer ppVar2;
  undefined8 uVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  string *psVar7;
  char *pcVar8;
  istream *piVar9;
  pointer ppFVar10;
  ZeroCopyOutputStream *pZVar11;
  const_iterator cVar12;
  undefined4 extraout_var_00;
  size_type sVar13;
  FileDescriptor *file_00;
  ulong uVar14;
  pointer pbVar15;
  StringPiece full;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string filepath;
  bool value;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  skip_impls;
  Options generation_options;
  ifstream skip_file;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_428;
  string *local_408;
  pointer local_400;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_3f8;
  GeneratorContext *local_3f0;
  undefined1 local_3e8 [32];
  pointer local_3c8;
  pointer local_3c0;
  undefined1 local_3b8 [168];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_310;
  undefined1 local_2d8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  _Alloc_hider local_2a0;
  char local_290 [16];
  _Alloc_hider local_280;
  char local_270 [16];
  _Alloc_hider local_260;
  char local_250 [16];
  bool local_240;
  bool local_23f [7];
  FileGenerator local_238;
  undefined4 extraout_var;
  
  local_408 = error;
  local_3f8 = files;
  local_3f0 = context;
  Options::Options((Options *)local_2d8);
  local_428.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseGeneratorParameter(parameter,&local_428);
  if (local_428.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_428.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar14 = 0;
LAB_0026947f:
    iVar6 = std::__cxx11::string::compare
                      ((char *)(local_428.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar14));
    if (iVar6 == 0) {
      psVar7 = (string *)local_2d8;
      goto LAB_00269593;
    }
    iVar6 = std::__cxx11::string::compare
                      ((char *)(local_428.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar14));
    if (iVar6 == 0) {
      this_00 = (protobuf *)
                local_428.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar14].second._M_dataplus._M_p;
      pcVar8 = (char *)local_428.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar14].second._M_string_length;
      if ((long)pcVar8 < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  ((size_t)pcVar8,"string length exceeds max size");
      }
      local_3b8._0_8_ = (pointer)0x0;
      local_3b8._8_8_ = (pointer)0x0;
      local_3b8._16_8_ = (pointer)0x0;
      full.length_ = (size_type)";";
      full.ptr_ = pcVar8;
      SplitStringUsing(this_00,full,local_3b8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)error);
      uVar3 = local_3b8._8_8_;
      for (pbVar15 = (pointer)local_3b8._0_8_; pbVar15 != (pointer)uVar3; pbVar15 = pbVar15 + 1) {
        local_310._M_buckets = (__buckets_ptr)(pbVar15->_M_dataplus)._M_p;
        local_310._M_bucket_count = 0;
        size = pbVar15->_M_string_length;
        if ((long)size < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (size,"string length exceeds max size");
        }
        local_310._M_bucket_count = size;
        stringpiece_internal::StringPiece::ToString_abi_cxx11_
                  ((string *)&local_238,(StringPiece *)&local_310);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238);
        if (local_238.file_ != (FileDescriptor *)&local_238.root_class_name_._M_string_length) {
          operator_delete(local_238.file_);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3b8);
    }
    else {
      iVar6 = std::__cxx11::string::compare
                        ((char *)(local_428.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar14));
      if (iVar6 == 0) {
        bVar5 = anon_unknown_3::StringToBool
                          ((anon_unknown_3 *)
                           local_428.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar14].second._M_dataplus._M_p
                           ,(string *)
                            local_428.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar14].second.
                            _M_string_length,&local_240);
        if (!bVar5) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_238,"error: Unknown value for prefixes_must_be_registered: ",
                         &local_428.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar14].second);
          goto LAB_00269c9a;
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare
                          ((char *)(local_428.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar14));
        if (iVar6 == 0) {
          bVar5 = anon_unknown_3::StringToBool
                            ((anon_unknown_3 *)
                             local_428.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar14].second._M_dataplus.
                             _M_p,(string *)
                                  local_428.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar14].second.
                                  _M_string_length,local_23f);
          if (!bVar5) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_238,"error: Unknown value for require_prefixes: ",
                           &local_428.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar14].second);
            goto LAB_00269c9a;
          }
        }
        else {
          iVar6 = std::__cxx11::string::compare
                            ((char *)(local_428.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar14));
          if (iVar6 == 0) {
            psVar7 = (string *)&local_2a0;
          }
          else {
            iVar6 = std::__cxx11::string::compare
                              ((char *)(local_428.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar14));
            if (iVar6 != 0) {
              iVar6 = std::__cxx11::string::compare
                                ((char *)(local_428.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar14));
              ppVar2 = local_428.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (iVar6 == 0) {
                local_3b8._0_8_ = local_3b8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"/","");
                local_3c0 = ppVar2[uVar14].second._M_dataplus._M_p;
                local_400 = (pointer)ppVar2[uVar14].second._M_string_length;
                if ((long)local_400 < 0) {
                  stringpiece_internal::StringPiece::LogFatalSizeTooBig
                            ((size_t)local_400,"string length exceeds max size");
                }
                uVar3 = local_3b8._8_8_;
                local_3c8 = (pointer)local_3b8._0_8_;
                if ((long)local_3b8._8_8_ < 0) {
                  stringpiece_internal::StringPiece::LogFatalSizeTooBig
                            (local_3b8._8_8_,"string length exceeds max size");
                }
                if (local_400 < (ulong)uVar3) {
                  sVar13 = ppVar2[uVar14].second._M_string_length;
LAB_002697c2:
                  local_238.file_ = (FileDescriptor *)&local_238.root_class_name_._M_string_length;
                  pcVar1 = ppVar2[uVar14].second._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_238,pcVar1,pcVar1 + sVar13);
                }
                else {
                  iVar6 = bcmp((char *)((long)local_400 + ((long)local_3c0 - uVar3)),local_3c8,uVar3
                              );
                  sVar13 = ppVar2[uVar14].second._M_string_length;
                  if (iVar6 != 0) goto LAB_002697c2;
                  std::__cxx11::string::substr((ulong)&local_238,(ulong)&ppVar2[uVar14].second);
                }
                std::__cxx11::string::operator=((string *)&local_260,(string *)&local_238);
                if (local_238.file_ !=
                    (FileDescriptor *)&local_238.root_class_name_._M_string_length) {
                  operator_delete(local_238.file_);
                }
                if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
                  operator_delete((void *)local_3b8._0_8_);
                }
                goto LAB_002696be;
              }
              iVar6 = std::__cxx11::string::compare
                                ((char *)(local_428.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar14));
              if (iVar6 == 0) {
                local_3b8._0_8_ = local_3b8._0_8_ & 0xffffffffffffff00;
                bVar5 = anon_unknown_3::StringToBool
                                  ((anon_unknown_3 *)
                                   local_428.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar14].second.
                                   _M_dataplus._M_p,
                                   (string *)
                                   local_428.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar14].second.
                                   _M_string_length,(bool *)local_3b8);
                if (bVar5) {
                  SetUseProtoPackageAsDefaultPrefix((bool)local_3b8[0]);
                  goto LAB_002696be;
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_238,"error: Unknown use_package_as_prefix: ",
                               &local_428.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar14].second);
LAB_00269c9a:
                std::__cxx11::string::operator=((string *)local_408,(string *)&local_238);
                if (local_238.file_ !=
                    (FileDescriptor *)&local_238.root_class_name_._M_string_length) {
                  operator_delete(local_238.file_);
                }
                bVar5 = false;
                goto LAB_00269b95;
              }
              iVar6 = std::__cxx11::string::compare
                                ((char *)(local_428.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar14));
              if (iVar6 != 0) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_238,"error: Unknown generator option: ",
                               &local_428.
                                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar14].first);
                goto LAB_00269c9a;
              }
              SetProtoPackagePrefixExceptionList
                        (&local_428.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar14].second);
              goto LAB_002696be;
            }
            psVar7 = (string *)&local_280;
          }
LAB_00269593:
          std::__cxx11::string::_M_assign(psVar7);
        }
      }
    }
LAB_002696be:
    uVar14 = uVar14 + 1;
    if ((ulong)((long)local_428.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_428.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) <= uVar14) goto LAB_0026987f;
    goto LAB_0026947f;
  }
LAB_0026987f:
  local_400 = (pointer)getenv("GPB_OBJC_HEADERS_ONLY");
  local_310._M_buckets = &local_310._M_single_bucket;
  local_310._M_bucket_count = 1;
  local_310._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_310._M_element_count = 0;
  local_310._M_rehash_policy._M_max_load_factor = 1.0;
  local_310._M_rehash_policy._M_next_resize = 0;
  local_310._M_single_bucket = (__node_base_ptr)0x0;
  pcVar8 = getenv("GPB_OBJC_SKIP_IMPLS_FILE");
  if (pcVar8 == (char *)0x0) {
LAB_002699be:
    bVar5 = ValidateObjCClassPrefixes(local_3f8,(Options *)local_2d8,local_408);
    if (bVar5) {
      ppFVar10 = (local_3f8->
                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      bVar5 = true;
      if ((local_3f8->
          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppFVar10) {
        pbVar15 = (pointer)(local_3b8 + 0x10);
        uVar14 = 0;
        do {
          file = ppFVar10[uVar14];
          FileGenerator::FileGenerator(&local_238,file,(Options *)local_2d8);
          FilePath_abi_cxx11_((string *)local_3e8,(objectivec *)file,file_00);
          local_3b8._0_8_ = pbVar15;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3b8,local_3e8._0_8_,
                     (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)(local_3e8._0_8_ + local_3e8._8_8_));
          std::__cxx11::string::append((char *)local_3b8);
          iVar6 = (*local_3f0->_vptr_GeneratorContext[2])(local_3f0,(Printer *)local_3b8);
          pZVar11 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar6);
          if ((pointer)local_3b8._0_8_ != pbVar15) {
            operator_delete((void *)local_3b8._0_8_);
          }
          io::Printer::Printer((Printer *)local_3b8,pZVar11,'$');
          FileGenerator::GenerateHeader(&local_238,(Printer *)local_3b8);
          io::Printer::~Printer((Printer *)local_3b8);
          if (pZVar11 != (ZeroCopyOutputStream *)0x0) {
            (*pZVar11->_vptr_ZeroCopyOutputStream[1])(pZVar11);
          }
          if ((local_400 == (pointer)0x0) &&
             (cVar12 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::find(&local_310,*(key_type **)file),
             cVar12.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur == (__node_type *)0x0)) {
            local_3b8._0_8_ = pbVar15;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3b8,local_3e8._0_8_,
                       (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)(local_3e8._0_8_ + local_3e8._8_8_));
            std::__cxx11::string::append((char *)local_3b8);
            iVar6 = (*local_3f0->_vptr_GeneratorContext[2])(local_3f0,(Printer *)local_3b8);
            pZVar11 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar6);
            if ((pointer)local_3b8._0_8_ != pbVar15) {
              operator_delete((void *)local_3b8._0_8_);
            }
            io::Printer::Printer((Printer *)local_3b8,pZVar11,'$');
            FileGenerator::GenerateSource(&local_238,(Printer *)local_3b8);
            io::Printer::~Printer((Printer *)local_3b8);
            if (pZVar11 != (ZeroCopyOutputStream *)0x0) {
              (*pZVar11->_vptr_ZeroCopyOutputStream[1])(pZVar11);
            }
          }
          if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)local_3e8._0_8_ !=
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)(local_3e8 + 0x10)) {
            operator_delete((void *)local_3e8._0_8_);
          }
          FileGenerator::~FileGenerator(&local_238);
          uVar14 = uVar14 + 1;
          ppFVar10 = (local_3f8->
                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar14 < (ulong)((long)(local_3f8->
                                        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar10
                                 >> 3));
        bVar5 = true;
      }
      goto LAB_00269b88;
    }
  }
  else {
    pcVar8 = getenv("GPB_OBJC_SKIP_IMPLS_FILE");
    std::ifstream::ifstream(&local_238,pcVar8,_S_in);
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 != '\0') {
      local_3b8._8_8_ = (pointer)0x0;
      local_3b8._16_8_ = local_3b8._16_8_ & 0xffffffffffffff00;
      local_3b8._0_8_ = (pointer)(local_3b8 + 0x10);
      while( true ) {
        cVar4 = std::ios::widen((char)*(undefined8 *)(local_238.file_ + -0x18) + (char)&local_238);
        piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&local_238,(string *)local_3b8,cVar4);
        if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
        local_3e8._0_8_ = &local_310;
        std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_310,(string *)local_3b8,local_3e8);
      }
      if ((pointer)local_3b8._0_8_ != (pointer)(local_3b8 + 0x10)) {
        operator_delete((void *)local_3b8._0_8_);
      }
      std::ifstream::~ifstream(&local_238);
      goto LAB_002699be;
    }
    std::__cxx11::string::_M_replace
              ((ulong)local_408,0,(char *)local_408->_M_string_length,0x3e5135);
    std::ifstream::~ifstream(&local_238);
  }
  bVar5 = false;
LAB_00269b88:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_310);
LAB_00269b95:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_428);
  if (local_260._M_p != local_250) {
    operator_delete(local_260._M_p);
  }
  if (local_280._M_p != local_270) {
    operator_delete(local_280._M_p);
  }
  if (local_2a0._M_p != local_290) {
    operator_delete(local_2a0._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
  if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
    operator_delete((void *)local_2d8._0_8_);
  }
  return bVar5;
}

Assistant:

bool ObjectiveCGenerator::GenerateAll(
    const std::vector<const FileDescriptor*>& files,
    const std::string& parameter, GeneratorContext* context,
    std::string* error) const {
  // -----------------------------------------------------------------
  // Parse generator options. These options are passed to the compiler using the
  // --objc_opt flag. The options are passed as a comma separated list of
  // options along with their values. If the option appears multiple times, only
  // the last value will be considered.
  //
  // e.g. protoc ... --objc_opt=expected_prefixes=file.txt,generate_for_named_framework=MyFramework

  Options generation_options;

  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);
  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "expected_prefixes_path") {
      // Path to find a file containing the expected prefixes
      // (objc_class_prefix "PREFIX") for proto packages (package NAME). The
      // generator will then issue warnings/errors if in the proto files being
      // generated the option is not listed/wrong/etc in the file.
      //
      // The format of the file is:
      //   - An entry is a line of "package=prefix".
      //   - Comments start with "#".
      //   - A comment can go on a line after a expected package/prefix pair.
      //     (i.e. - "package=prefix # comment")
      //
      // There is no validation that the prefixes are good prefixes, it is
      // assumed that they are when you create the file.
      generation_options.expected_prefixes_path = options[i].second;
    } else if (options[i].first == "expected_prefixes_suppressions") {
      // A semicolon delimited string that lists the paths of .proto files to
      // exclude from the package prefix validations (expected_prefixes_path).
      // This is provided as an "out", to skip some files being checked.
      for (StringPiece split_piece : Split(
               options[i].second, ";", true)) {
        generation_options.expected_prefixes_suppressions.push_back(
            std::string(split_piece));
      }
    } else if (options[i].first == "prefixes_must_be_registered") {
      // If objc prefix file option value must be registered to be used. This
      // option has no meaning if an "expected_prefixes_path" isn't set. The
      // available options are:
      //   "no": They don't have to be registered.
      //   "yes": They must be registered and an error will be raised if a files
      //     tried to use a prefix that isn't registered.
      // Default is "no".
      if (!StringToBool(options[i].second,
                        &generation_options.prefixes_must_be_registered)) {
        *error = "error: Unknown value for prefixes_must_be_registered: " + options[i].second;
        return false;
      }
    } else if (options[i].first == "require_prefixes") {
      // If every file must have an objc prefix file option to be used. The
      // available options are:
      //   "no": Files can be generated without the prefix option.
      //   "yes": Files must have the objc prefix option, and an error will be
      //     raised if a files doesn't have one.
      // Default is "no".
      if (!StringToBool(options[i].second,
                        &generation_options.require_prefixes)) {
        *error = "error: Unknown value for require_prefixes: " + options[i].second;
        return false;
      }
    } else if (options[i].first == "generate_for_named_framework") {
      // The name of the framework that protos are being generated for. This
      // will cause the #import statements to be framework based using this
      // name (i.e. - "#import <NAME/proto.pbobjc.h>).
      //
      // NOTE: If this option is used with
      // named_framework_to_proto_path_mappings_path, then this is effectively
      // the "default" framework name used for everything that wasn't mapped by
      // the mapping file.
      generation_options.generate_for_named_framework = options[i].second;
    } else if (options[i].first == "named_framework_to_proto_path_mappings_path") {
      // Path to find a file containing the list of framework names and proto
      // files. The generator uses this to decide if a proto file
      // referenced should use a framework style import vs. a user level import
      // (#import <FRAMEWORK/file.pbobjc.h> vs #import "dir/file.pbobjc.h").
      //
      // The format of the file is:
      //   - An entry is a line of "frameworkName: file.proto, dir/file2.proto".
      //   - Comments start with "#".
      //   - A comment can go on a line after a expected package/prefix pair.
      //     (i.e. - "frameworkName: file.proto # comment")
      //
      // Any number of files can be listed for a framework, just separate them
      // with commas.
      //
      // There can be multiple lines listing the same frameworkName in case it
      // has a lot of proto files included in it; having multiple lines makes
      // things easier to read. If a proto file is not configured in the
      // mappings file, it will use the default framework name if one was passed
      // with generate_for_named_framework, or the relative path to it's include
      // path otherwise.
      generation_options.named_framework_to_proto_path_mappings_path = options[i].second;
    } else if (options[i].first == "runtime_import_prefix") {
      // Path to use as a prefix on #imports of runtime provided headers in the
      // generated files. When integrating ObjC protos into a build system,
      // this can be used to avoid having to add the runtime directory to the
      // header search path since the generate #import will be more complete.
      generation_options.runtime_import_prefix =
          StripSuffixString(options[i].second, "/");
    } else if (options[i].first == "use_package_as_prefix") {
      // Controls how the symbols should be prefixed to avoid symbols
      // collisions. The objc_class_prefix file option is always honored, this
      // is just what to do if that isn't set. The available options are:
      //   "no": Not prefixed (the existing mode).
      //   "yes": Make a prefix out of the proto package.
      bool value = false;
      if (StringToBool(options[i].second, &value)) {
        SetUseProtoPackageAsDefaultPrefix(value);
      } else {
        *error = "error: Unknown use_package_as_prefix: " + options[i].second;
        return false;
      }
    } else if (options[i].first == "proto_package_prefix_exceptions_path") {
      // Path to find a file containing the list of proto package names that are
      // exceptions when use_package_as_prefix is enabled. This can be used to
      // migrate packages one at a time to use_package_as_prefix since there
      // are likely code updates needed with each one.
      //
      // The format of the file is:
      //   - An entry is a line of "proto.package.name".
      //   - Comments start with "#".
      //   - A comment can go on a line after a expected package/prefix pair.
      //     (i.e. - "some.proto.package # comment")
      SetProtoPackagePrefixExceptionList(options[i].second);
    } else {
      *error = "error: Unknown generator option: " + options[i].first;
      return false;
    }
  }

  // -----------------------------------------------------------------

  // These are not official generation options and could be removed/changed in
  // the future and doing that won't count as a breaking change.
  bool headers_only = getenv("GPB_OBJC_HEADERS_ONLY") != NULL;
  std::unordered_set<std::string> skip_impls;
  if (getenv("GPB_OBJC_SKIP_IMPLS_FILE") != NULL) {
    std::ifstream skip_file(getenv("GPB_OBJC_SKIP_IMPLS_FILE"));
    if (skip_file.is_open()) {
      std::string line;
      while (std::getline(skip_file, line)) {
        skip_impls.insert(line);
      }
    } else {
      *error = "error: Failed to open GPB_OBJC_SKIP_IMPLS_FILE file";
      return false;
    }
  }

  // -----------------------------------------------------------------

  // Validate the objc prefix/package pairings.
  if (!ValidateObjCClassPrefixes(files, generation_options, error)) {
    // *error will have been filled in.
    return false;
  }

  for (int i = 0; i < files.size(); i++) {
    const FileDescriptor* file = files[i];
    FileGenerator file_generator(file, generation_options);
    std::string filepath = FilePath(file);

    // Generate header.
    {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          context->Open(filepath + ".pbobjc.h"));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateHeader(&printer);
    }

    // Generate m file.
    if (!headers_only && skip_impls.count(file->name()) == 0) {
      std::unique_ptr<io::ZeroCopyOutputStream> output(
          context->Open(filepath + ".pbobjc.m"));
      io::Printer printer(output.get(), '$');
      file_generator.GenerateSource(&printer);
    }
  }

  return true;
}